

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Array<kj::ReadableDirectory::Entry> * __thiscall
kj::anon_unknown_8::DiskHandle::listEntries
          (Array<kj::ReadableDirectory::Entry> *__return_storage_ptr__,DiskHandle *this)

{
  anon_class_1_0_00000001 local_19;
  DiskHandle *local_18;
  DiskHandle *this_local;
  
  local_18 = this;
  this_local = (DiskHandle *)__return_storage_ptr__;
  (anonymous_namespace)::DiskHandle::
  list<kj::(anonymous_namespace)::DiskHandle::listEntries()const::_lambda(kj::StringPtr,kj::FsNode::Type)_1_>
            (__return_storage_ptr__,this,true,&local_19);
  return __return_storage_ptr__;
}

Assistant:

Array<ReadableDirectory::Entry> listEntries() const {
    return list(true, [](StringPtr name, FsNode::Type type) {
      return ReadableDirectory::Entry { type, heapString(name), };
    });
  }